

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronAddNamespace(xmlSchematronParserCtxtPtr ctxt,xmlChar *prefix,xmlChar *ns)

{
  xmlChar **ppxVar1;
  xmlChar *pxVar2;
  xmlChar **tmp;
  xmlChar *ns_local;
  xmlChar *prefix_local;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  if (ctxt->namespaces == (xmlChar **)0x0) {
    ctxt->maxNamespaces = 10;
    ppxVar1 = (xmlChar **)(*xmlMalloc)((long)(ctxt->maxNamespaces << 1) << 3);
    ctxt->namespaces = ppxVar1;
    if (ctxt->namespaces == (xmlChar **)0x0) {
      xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
      return;
    }
    ctxt->nbNamespaces = 0;
  }
  else if (ctxt->maxNamespaces <= ctxt->nbNamespaces + 2) {
    ppxVar1 = (xmlChar **)(*xmlRealloc)(ctxt->namespaces,(long)(ctxt->maxNamespaces << 2) << 3);
    if (ppxVar1 == (xmlChar **)0x0) {
      xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
      return;
    }
    ctxt->namespaces = ppxVar1;
    ctxt->maxNamespaces = ctxt->maxNamespaces << 1;
  }
  pxVar2 = xmlDictLookup(ctxt->dict,ns,-1);
  ctxt->namespaces[ctxt->nbNamespaces << 1] = pxVar2;
  pxVar2 = xmlDictLookup(ctxt->dict,prefix,-1);
  ctxt->namespaces[ctxt->nbNamespaces * 2 + 1] = pxVar2;
  ctxt->nbNamespaces = ctxt->nbNamespaces + 1;
  ctxt->namespaces[ctxt->nbNamespaces << 1] = (xmlChar *)0x0;
  ctxt->namespaces[ctxt->nbNamespaces * 2 + 1] = (xmlChar *)0x0;
  return;
}

Assistant:

static void
xmlSchematronAddNamespace(xmlSchematronParserCtxtPtr ctxt,
                          const xmlChar *prefix, const xmlChar *ns)
{
    if (ctxt->namespaces == NULL) {
        ctxt->maxNamespaces = 10;
        ctxt->namespaces = (const xmlChar **)
            xmlMalloc(ctxt->maxNamespaces * 2 * sizeof(const xmlChar *));
        if (ctxt->namespaces == NULL) {
            xmlSchematronPErrMemory(NULL);
            return;
        }
        ctxt->nbNamespaces = 0;
    } else if (ctxt->nbNamespaces + 2 >= ctxt->maxNamespaces) {
        const xmlChar **tmp;

        tmp = (const xmlChar **)
            xmlRealloc((xmlChar **) ctxt->namespaces, ctxt->maxNamespaces * 4 *
                       sizeof(const xmlChar *));
        if (tmp == NULL) {
            xmlSchematronPErrMemory(NULL);
            return;
        }
        ctxt->namespaces = tmp;
        ctxt->maxNamespaces *= 2;
    }
    ctxt->namespaces[2 * ctxt->nbNamespaces] =
        xmlDictLookup(ctxt->dict, ns, -1);
    ctxt->namespaces[2 * ctxt->nbNamespaces + 1] =
        xmlDictLookup(ctxt->dict, prefix, -1);
    ctxt->nbNamespaces++;
    ctxt->namespaces[2 * ctxt->nbNamespaces] = NULL;
    ctxt->namespaces[2 * ctxt->nbNamespaces + 1] = NULL;

}